

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O0

int Abc_NtkRetimeFinalizeLatches
              (Abc_Ntk_t *pNtk,st__table *tLatches,int nIdMaxStart,int fUseOldNames)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  int local_80;
  int local_7c;
  int Index;
  int i;
  Abc_Obj_t *pLatchOut;
  Abc_Obj_t *pLatchIn;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vBoxesNew;
  Vec_Ptr_t *vCosNew;
  Vec_Ptr_t *vCisNew;
  Vec_Ptr_t *vBoxesOld;
  Vec_Ptr_t *vCosOld;
  Vec_Ptr_t *vCisOld;
  int fUseOldNames_local;
  int nIdMaxStart_local;
  st__table *tLatches_local;
  Abc_Ntk_t *pNtk_local;
  
  vCosOld = pNtk->vCis;
  pNtk->vCis = (Vec_Ptr_t *)0x0;
  vCisOld._0_4_ = fUseOldNames;
  vCisOld._4_4_ = nIdMaxStart;
  _fUseOldNames_local = tLatches;
  tLatches_local = (st__table *)pNtk;
  vCosNew = Vec_PtrAlloc(100);
  vBoxesOld = *(Vec_Ptr_t **)&tLatches_local[1].num_bins;
  tLatches_local[1].num_bins = 0;
  tLatches_local[1].num_entries = 0;
  vBoxesNew = Vec_PtrAlloc(100);
  vCisNew = (Vec_Ptr_t *)tLatches_local[1].grow_factor;
  tLatches_local[1].grow_factor = 0.0;
  pObj = (Abc_Obj_t *)Vec_PtrAlloc(100);
  for (local_7c = 0; iVar4 = local_7c, iVar2 = Vec_PtrSize(vCosOld),
      iVar4 < iVar2 - _fUseOldNames_local->num_entries; local_7c = local_7c + 1) {
    pLatch = (Abc_Obj_t *)Vec_PtrEntry(vCosOld,local_7c);
    Vec_PtrPush(vCosNew,pLatch);
  }
  for (local_7c = 0; iVar4 = local_7c, iVar2 = Vec_PtrSize(vBoxesOld),
      iVar4 < iVar2 - _fUseOldNames_local->num_entries; local_7c = local_7c + 1) {
    pLatch = (Abc_Obj_t *)Vec_PtrEntry(vBoxesOld,local_7c);
    Vec_PtrPush(vBoxesNew,pLatch);
  }
  for (local_7c = 0; iVar4 = local_7c, iVar2 = Vec_PtrSize(vCisNew),
      iVar4 < iVar2 - _fUseOldNames_local->num_entries; local_7c = local_7c + 1) {
    pLatch = (Abc_Obj_t *)Vec_PtrEntry(vCisNew,local_7c);
    Vec_PtrPush((Vec_Ptr_t *)pObj,pLatch);
  }
  local_7c = 0;
  do {
    iVar4 = local_7c;
    iVar2 = Vec_PtrSize((Vec_Ptr_t *)tLatches_local->grow_factor);
    if (iVar2 <= iVar4) {
      for (local_7c = 0; iVar4 = local_7c, iVar2 = Vec_PtrSize(vCosOld), iVar4 < iVar2;
          local_7c = local_7c + 1) {
        pLatch = (Abc_Obj_t *)Vec_PtrEntry(vCosOld,local_7c);
        iVar4 = Abc_ObjIsPi(pLatch);
        if (((iVar4 == 0) && (iVar4 = Abc_ObjFaninNum(pLatch), iVar4 == 0)) &&
           (iVar4 = Abc_ObjFanoutNum(pLatch), iVar4 == 0)) {
          Abc_NtkDeleteObj(pLatch);
        }
      }
      for (local_7c = 0; iVar4 = local_7c, iVar2 = Vec_PtrSize(vBoxesOld), iVar4 < iVar2;
          local_7c = local_7c + 1) {
        pLatch = (Abc_Obj_t *)Vec_PtrEntry(vBoxesOld,local_7c);
        iVar4 = Abc_ObjIsPo(pLatch);
        if (((iVar4 == 0) && (iVar4 = Abc_ObjFaninNum(pLatch), iVar4 == 0)) &&
           (iVar4 = Abc_ObjFanoutNum(pLatch), iVar4 == 0)) {
          Abc_NtkDeleteObj(pLatch);
        }
      }
      tLatches_local[1].hash = (st__hash_func_type)vCosNew;
      Vec_PtrFree(vCosOld);
      *(Vec_Ptr_t **)&tLatches_local[1].num_bins = vBoxesNew;
      Vec_PtrFree(vBoxesOld);
      tLatches_local[1].grow_factor = (double)pObj;
      Vec_PtrFree(vCisNew);
      return 1;
    }
    pLatchIn = Abc_NtkObj((Abc_Ntk_t *)tLatches_local,local_7c);
    if ((pLatchIn != (Abc_Obj_t *)0x0) && (iVar4 = Abc_ObjIsLatch(pLatchIn), iVar4 != 0)) {
      uVar3 = Abc_ObjId(pLatchIn);
      if (uVar3 < vCisOld._4_4_) {
        iVar4 = st__lookup_int(_fUseOldNames_local,(char *)pLatchIn,&local_80);
        pVVar1 = vCisNew;
        pAVar5 = pLatchIn;
        if (iVar4 == 0) {
          printf("Abc_NtkRetimeFinalizeLatches(): Internal error.\n");
          return 0;
        }
        iVar4 = Vec_PtrSize(vCisNew);
        pAVar7 = (Abc_Obj_t *)
                 Vec_PtrEntry(pVVar1,(iVar4 - _fUseOldNames_local->num_entries) + local_80);
        pVVar1 = vBoxesOld;
        if (pAVar5 != pAVar7) {
          __assert_fail("pLatch == Vec_PtrEntry(vBoxesOld, Vec_PtrSize(vBoxesOld) - st__count(tLatches) + Index)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/ret/retIncrem.c"
                        ,0xc1,"int Abc_NtkRetimeFinalizeLatches(Abc_Ntk_t *, st__table *, int, int)"
                       );
        }
        iVar4 = Vec_PtrSize(vBoxesOld);
        pLatchOut = (Abc_Obj_t *)
                    Vec_PtrEntry(pVVar1,(iVar4 - _fUseOldNames_local->num_entries) + local_80);
        pVVar1 = vCosOld;
        iVar4 = Vec_PtrSize(vCosOld);
        _Index = (Abc_Obj_t *)
                 Vec_PtrEntry(pVVar1,(iVar4 - _fUseOldNames_local->num_entries) + local_80);
      }
      else {
        pLatchOut = Abc_NtkCreateBi((Abc_Ntk_t *)tLatches_local);
        pAVar5 = Abc_NtkCreateBo((Abc_Ntk_t *)tLatches_local);
        _Index = pAVar5;
        if ((int)vCisOld == 0) {
          pAVar7 = Abc_ObjFanin0(pLatchIn);
          pcVar6 = Abc_ObjName(pAVar7);
          Abc_ObjAssignName(pAVar5,pcVar6,"_o2");
          pAVar5 = pLatchOut;
          pAVar7 = Abc_ObjFanin0(pLatchIn);
          pcVar6 = Abc_ObjName(pAVar7);
          Abc_ObjAssignName(pAVar5,pcVar6,"_i2");
        }
        else {
          pcVar6 = Abc_ObjName(pLatchIn);
          Abc_ObjAssignName(pAVar5,pcVar6,"_out");
          pAVar5 = pLatchOut;
          pcVar6 = Abc_ObjName(pLatchIn);
          Abc_ObjAssignName(pAVar5,pcVar6,"_in");
        }
      }
      pAVar5 = pLatchOut;
      pAVar7 = Abc_ObjFanin0(pLatchIn);
      Abc_ObjAddFanin(pAVar5,pAVar7);
      pAVar5 = pLatchIn;
      pAVar7 = Abc_ObjFanin0(pLatchIn);
      Abc_ObjPatchFanin(pAVar5,pAVar7,pLatchOut);
      iVar4 = Abc_ObjFanoutNum(pLatchIn);
      if (0 < iVar4) {
        Abc_ObjTransferFanout(pLatchIn,_Index);
      }
      Abc_ObjAddFanin(_Index,pLatchIn);
      Vec_PtrPush(vCosNew,_Index);
      Vec_PtrPush(vBoxesNew,pLatchOut);
      Vec_PtrPush((Vec_Ptr_t *)pObj,pLatchIn);
    }
    local_7c = local_7c + 1;
  } while( true );
}

Assistant:

int Abc_NtkRetimeFinalizeLatches( Abc_Ntk_t * pNtk, st__table * tLatches, int nIdMaxStart, int fUseOldNames )
{
    Vec_Ptr_t * vCisOld, * vCosOld, * vBoxesOld, * vCisNew, * vCosNew, * vBoxesNew;
    Abc_Obj_t * pObj, * pLatch, * pLatchIn, * pLatchOut;
    int i, Index;
    // create new arrays
    vCisOld   = pNtk->vCis;    pNtk->vCis   = NULL;  vCisNew   = Vec_PtrAlloc( 100 );
    vCosOld   = pNtk->vCos;    pNtk->vCos   = NULL;  vCosNew   = Vec_PtrAlloc( 100 );  
    vBoxesOld = pNtk->vBoxes;  pNtk->vBoxes = NULL;  vBoxesNew = Vec_PtrAlloc( 100 );
    // copy boxes and their CIs/COs
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vCisOld, pObj, i, Vec_PtrSize(vCisOld) - st__count(tLatches) )
        Vec_PtrPush( vCisNew, pObj );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vCosOld, pObj, i, Vec_PtrSize(vCosOld) - st__count(tLatches) )
        Vec_PtrPush( vCosNew, pObj );
    Vec_PtrForEachEntryStop( Abc_Obj_t *, vBoxesOld, pObj, i, Vec_PtrSize(vBoxesOld) - st__count(tLatches) )
        Vec_PtrPush( vBoxesNew, pObj );
    // go through the latches
    Abc_NtkForEachObj( pNtk, pLatch, i )
    {
        if ( !Abc_ObjIsLatch(pLatch) )
            continue;
        if ( Abc_ObjId(pLatch) >= (unsigned)nIdMaxStart )
        {
            // this is a new latch 
            pLatchIn  = Abc_NtkCreateBi(pNtk);
            pLatchOut = Abc_NtkCreateBo(pNtk);

            if ( fUseOldNames )
            {
                Abc_ObjAssignName( pLatchOut, Abc_ObjName(pLatch), "_out" );
                Abc_ObjAssignName( pLatchIn,  Abc_ObjName(pLatch), "_in" );
            }
            else
            {
                Abc_ObjAssignName( pLatchOut, Abc_ObjName(Abc_ObjFanin0(pLatch)), "_o2" );
                Abc_ObjAssignName( pLatchIn,  Abc_ObjName(Abc_ObjFanin0(pLatch)), "_i2" );
            }
        }
        else
        {
            // this is an old latch 
            // get its number in the original order
            if ( ! st__lookup_int( tLatches, (char *)pLatch, &Index ) )
            {
                printf( "Abc_NtkRetimeFinalizeLatches(): Internal error.\n" );
                return 0;
            }
            assert( pLatch == Vec_PtrEntry(vBoxesOld, Vec_PtrSize(vBoxesOld) - st__count(tLatches) + Index) );
            // reconnect with the old LIs/LOs
            pLatchIn  = (Abc_Obj_t *)Vec_PtrEntry( vCosOld, Vec_PtrSize(vCosOld) - st__count(tLatches) + Index );
            pLatchOut = (Abc_Obj_t *)Vec_PtrEntry( vCisOld, Vec_PtrSize(vCisOld) - st__count(tLatches) + Index );
        }
        // connect
        Abc_ObjAddFanin( pLatchIn, Abc_ObjFanin0(pLatch) );
        Abc_ObjPatchFanin( pLatch, Abc_ObjFanin0(pLatch), pLatchIn );
        if ( Abc_ObjFanoutNum(pLatch) > 0 )
            Abc_ObjTransferFanout( pLatch, pLatchOut );
        Abc_ObjAddFanin( pLatchOut, pLatch );
        // add to the arrays
        Vec_PtrPush( vCisNew, pLatchOut );
        Vec_PtrPush( vCosNew, pLatchIn );
        Vec_PtrPush( vBoxesNew, pLatch );
    }
    // free useless Cis/Cos
    Vec_PtrForEachEntry( Abc_Obj_t *, vCisOld, pObj, i )
        if ( !Abc_ObjIsPi(pObj) && Abc_ObjFaninNum(pObj) == 0 && Abc_ObjFanoutNum(pObj) == 0 )
            Abc_NtkDeleteObj(pObj);
    Vec_PtrForEachEntry( Abc_Obj_t *, vCosOld, pObj, i )
        if ( !Abc_ObjIsPo(pObj) && Abc_ObjFaninNum(pObj) == 0 && Abc_ObjFanoutNum(pObj) == 0 )
            Abc_NtkDeleteObj(pObj);
    // set the new arrays
    pNtk->vCis   = vCisNew;   Vec_PtrFree( vCisOld );
    pNtk->vCos   = vCosNew;   Vec_PtrFree( vCosOld );
    pNtk->vBoxes = vBoxesNew; Vec_PtrFree( vBoxesOld );
    return 1;
}